

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O0

int CONF_parse_list(char *list,int sep,int nospc,list_cb *list_cb,void *arg)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  char *p;
  char *tmpend;
  char *lstart;
  int ret;
  void *arg_local;
  _func_int_char_ptr_size_t_void_ptr *list_cb_local;
  int remove_whitespace_local;
  char sep_local;
  char *list_local;
  
  tmpend = list;
  if (list == (char *)0x0) {
    ERR_put_error(0xd,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                  ,0x248);
    list_local._4_4_ = 0;
  }
  else {
    while( true ) {
      if (nospc != 0) {
        while( true ) {
          bVar5 = false;
          if (*tmpend != '\0') {
            iVar1 = OPENSSL_isspace((uint)(byte)*tmpend);
            bVar5 = iVar1 != 0;
          }
          if (!bVar5) break;
          tmpend = tmpend + 1;
        }
      }
      pcVar2 = strchr(tmpend,(int)(char)sep);
      if ((pcVar2 == tmpend) || (*tmpend == '\0')) {
        lstart._4_4_ = (*list_cb)((char *)0x0,0,arg);
      }
      else {
        pcVar4 = pcVar2;
        if (pcVar2 == (char *)0x0) {
          sVar3 = strlen(tmpend);
          pcVar4 = tmpend + sVar3;
        }
        p = pcVar4 + -1;
        if (nospc != 0) {
          while (iVar1 = OPENSSL_isspace((uint)(byte)*p), iVar1 != 0) {
            p = p + -1;
          }
        }
        lstart._4_4_ = (*list_cb)(tmpend,((int)p - (int)tmpend) + 1,arg);
      }
      if (lstart._4_4_ < 1) {
        return lstart._4_4_;
      }
      if (pcVar2 == (char *)0x0) break;
      tmpend = pcVar2 + 1;
    }
    list_local._4_4_ = 1;
  }
  return list_local._4_4_;
}

Assistant:

int CONF_parse_list(const char *list, char sep, int remove_whitespace,
                    int (*list_cb)(const char *elem, size_t len, void *usr),
                    void *arg) {
  int ret;
  const char *lstart, *tmpend, *p;

  if (list == NULL) {
    OPENSSL_PUT_ERROR(CONF, CONF_R_LIST_CANNOT_BE_NULL);
    return 0;
  }

  lstart = list;
  for (;;) {
    if (remove_whitespace) {
      while (*lstart && OPENSSL_isspace((unsigned char)*lstart)) {
        lstart++;
      }
    }
    p = strchr(lstart, sep);
    if (p == lstart || !*lstart) {
      ret = list_cb(NULL, 0, arg);
    } else {
      if (p) {
        tmpend = p - 1;
      } else {
        tmpend = lstart + strlen(lstart) - 1;
      }
      if (remove_whitespace) {
        while (OPENSSL_isspace((unsigned char)*tmpend)) {
          tmpend--;
        }
      }
      ret = list_cb(lstart, tmpend - lstart + 1, arg);
    }
    if (ret <= 0) {
      return ret;
    }
    if (p == NULL) {
      return 1;
    }
    lstart = p + 1;
  }
}